

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VLinearCombination_ManyVector(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  void *__ptr;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  N_Vector *Xsub;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_38;
  undefined8 local_30;
  
  __ptr = malloc((long)in_EDI << 3);
  for (local_30 = 0; local_30 < *(long *)*in_RCX; local_30 = local_30 + 1) {
    for (local_38 = 0; local_38 < in_EDI; local_38 = local_38 + 1) {
      *(undefined8 *)((long)__ptr + local_38 * 8) =
           *(undefined8 *)(*(long *)(**(long **)(in_RDX + local_38 * 8) + 0x10) + local_30 * 8);
    }
    N_VLinearCombination
              (in_EDI,in_RSI,__ptr,*(undefined8 *)(*(long *)(*in_RCX + 0x10) + local_30 * 8));
  }
  free(__ptr);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VLinearCombination)(int nvec, sunrealtype* c, N_Vector* X,
                                          N_Vector z)
{
  SUNFunctionBegin(z->sunctx);
  sunindextype i, j;
  N_Vector* Xsub;

  /* create array of nvec N_Vector pointers for reuse within loop */
  Xsub = NULL;
  Xsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Xsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VLinearCombination for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(z); i++)
  {
    /* for each subvector, create the array of subvectors of X */
    for (j = 0; j < nvec; j++) { Xsub[j] = MANYVECTOR_SUBVEC(X[j], i); }

    /* now call N_VLinearCombination for this array of subvectors */
    SUNCheckCall(N_VLinearCombination(nvec, c, Xsub, MANYVECTOR_SUBVEC(z, i)));
  }

  /* clean up and return */
  free(Xsub);
  return SUN_SUCCESS;
}